

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O0

void __thiscall Raytracer::Scene::start(Scene *this,Image *img)

{
  RGB color;
  RGB color_00;
  float x_00;
  float y_00;
  bool bVar1;
  byte bVar2;
  RGB local_dc;
  RGB local_d0;
  RGB local_c0;
  undefined1 local_b4 [8];
  Vec3f usless;
  Shape **i;
  iterator __end3;
  iterator __begin3;
  vector<Raytracer::Shape_*,_std::allocator<Raytracer::Shape_*>_> *__range3;
  float local_74;
  float local_70;
  float local_6c;
  undefined1 local_68 [12];
  Camera local_5c;
  float local_4c;
  float local_48;
  Vec3<float> local_44;
  undefined1 local_38 [8];
  Ray ray;
  int x;
  int y;
  Image *img_local;
  Scene *this_local;
  
  for (ray.dir.z = 0.0; (int)ray.dir.z < img->height; ray.dir.z = (float)((int)ray.dir.z + 1)) {
    for (ray.dir.y = 0.0; (int)ray.dir.y < img->width; ray.dir.y = (float)((int)ray.dir.y + 1)) {
      local_48 = 0.0;
      local_4c = 0.0;
      local_5c.fov = 0.0;
      Vec3<float>::Vec3(&local_44,&local_48,&local_4c,&local_5c.fov);
      local_6c = (float)(int)ray.dir.y;
      local_70 = (float)(int)ray.dir.z;
      local_74 = -1.0;
      Vec3<float>::Vec3((Vec3<float> *)local_68,&local_6c,&local_70,&local_74);
      Camera::WorldToCamera((Camera *)(local_68 + 0xc),&(this->camera).origin,(Image *)local_68);
      Ray::Ray((Ray *)local_38,&local_44,(Vec3f *)(local_68 + 0xc));
      Vec3<float>::~Vec3((Vec3<float> *)(local_68 + 0xc));
      Vec3<float>::~Vec3((Vec3<float> *)local_68);
      Vec3<float>::~Vec3(&local_44);
      __end3 = std::vector<Raytracer::Shape_*,_std::allocator<Raytracer::Shape_*>_>::begin
                         (&this->objects);
      i = (Shape **)
          std::vector<Raytracer::Shape_*,_std::allocator<Raytracer::Shape_*>_>::end(&this->objects);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          (&__end3,(__normal_iterator<Raytracer::Shape_**,_std::vector<Raytracer::Shape_*,_std::allocator<Raytracer::Shape_*>_>_>
                                    *)&i);
        if (!bVar1) break;
        usless._4_8_ = __gnu_cxx::
                       __normal_iterator<Raytracer::Shape_**,_std::vector<Raytracer::Shape_*,_std::allocator<Raytracer::Shape_*>_>_>
                       ::operator*(&__end3);
        Vec3<float>::Vec3((Vec3<float> *)local_b4);
        bVar2 = (**(code **)(**(long **)usless._4_8_ + 0x10))
                          (*(long **)usless._4_8_,local_38,local_b4);
        y_00 = ray.dir.z;
        x_00 = ray.dir.y;
        if ((bVar2 & 1) == 0) {
          RGB::RGB(&local_dc,0.0,0.0,0.0);
          color.b = local_dc.b;
          color.r = local_dc.r;
          color.g = local_dc.g;
          Image::Update(img,(int)y_00,(int)x_00,color);
        }
        else {
          RGB::RGB(&local_c0,255.0,0.0,0.0);
          local_d0.b = local_c0.b;
          local_d0.r = local_c0.r;
          local_d0.g = local_c0.g;
          color_00.b = local_c0.b;
          color_00.r = local_c0.r;
          color_00.g = local_c0.g;
          Image::Update(img,(int)y_00,(int)x_00,color_00);
        }
        Vec3<float>::~Vec3((Vec3<float> *)local_b4);
        __gnu_cxx::
        __normal_iterator<Raytracer::Shape_**,_std::vector<Raytracer::Shape_*,_std::allocator<Raytracer::Shape_*>_>_>
        ::operator++(&__end3);
      }
      Ray::~Ray((Ray *)local_38);
    }
  }
  return;
}

Assistant:

void Raytracer::Scene::start(Raytracer::Image & img) {
    for(int y = 0;y<img.height;y++){
        for(int x = 0;x<img.width;x++) {

            Raytracer::Ray ray(Vec3f(0,0,0),camera.WorldToCamera(Vec3f(x,y,-1),img));
            for(auto &i : objects){
                Vec3f usless;
                if(i->isRayIntersect(ray,usless)){
                    img.Update(y,x,RGB(255, 0, 0));
                }else{
                    img.Update(y,x,RGB(0, 0, 0));
                }
            }
        }
    }
}